

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgpvd(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,double nulval,double *array,
          int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_70;
  double *local_68;
  double nullvalue;
  int nullcheck;
  char cdummy;
  long row;
  int *anynul_local;
  double *array_local;
  double nulval_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  nullvalue._0_4_ = 1;
  row = (long)anynul;
  anynul_local = (int *)array;
  array_local = (double *)nulval;
  nulval_local = (double)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_70 = 1;
    }
    else {
      local_70 = firstelem_local;
    }
    _nullcheck = local_70;
    ffgcld((fitsfile *)group_local,2,local_70,nelem_local,(LONGLONG)nulval_local,1,1,
           (double)array_local,(double *)anynul_local,(char *)((long)&nullvalue + 7),(int *)row,
           status);
    fptr_local._4_4_ = *status;
  }
  else {
    local_68 = array_local;
    fits_read_compressed_pixels
              ((fitsfile *)group_local,0x52,nelem_local,(LONGLONG)nulval_local,nullvalue._0_4_,
               &local_68,anynul_local,(char *)0x0,(int *)row,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpvd( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            double nulval,    /* I - value for undefined pixels              */
            double *array,    /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    double nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
         nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TDOUBLE, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcld(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}